

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

int sam_hdr_rebuild(SAM_hdr *hdr)

{
  khint32_t kVar1;
  SAM_hdr_type *pSVar2;
  char *pcVar3;
  kh_sam_hdr_t *pkVar4;
  ulong uVar5;
  char *__ptr;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  SAM_hdr_tag *pSVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  size_t __size;
  size_t sVar16;
  SAM_hdr_type *local_50;
  
  pkVar4 = hdr->h;
  uVar9 = pkVar4->n_buckets;
  if (uVar9 == 0) {
    uVar12 = 0;
LAB_00138fc6:
    __ptr = (char *)0x0;
    if (uVar12 == uVar9) {
      __size = 0;
      uVar14 = 0;
    }
    else {
      pSVar2 = pkVar4->vals[uVar12];
      __size = 8;
      __ptr = (char *)malloc(8);
      if (__ptr == (char *)0x0) {
        return -1;
      }
      builtin_strncpy(__ptr,"@HD",4);
      pSVar11 = (SAM_hdr_tag *)&pSVar2->tag;
      uVar7 = 3;
      while( true ) {
        pSVar11 = pSVar11->next;
        uVar14 = uVar7 + 1;
        if (pSVar11 == (SAM_hdr_tag *)0x0) break;
        if (__size < uVar14) {
          uVar5 = uVar7 >> 1 | uVar7;
          uVar5 = uVar5 >> 2 | uVar5;
          uVar5 = uVar5 >> 4 | uVar5;
          uVar5 = uVar5 >> 8 | uVar5;
          __size = (uVar5 >> 0x10 | uVar5) + 1;
          __ptr = (char *)realloc(__ptr,__size);
          if (__ptr == (char *)0x0) {
            return -1;
          }
        }
        __ptr[uVar7] = '\t';
        pcVar3 = pSVar11->str;
        iVar15 = pSVar11->len;
        sVar16 = (size_t)iVar15;
        if (__size < uVar14 + sVar16) {
          uVar7 = uVar7 + sVar16 >> 1 | uVar7 + sVar16;
          uVar7 = uVar7 >> 2 | uVar7;
          uVar7 = uVar7 >> 4 | uVar7;
          uVar7 = uVar7 >> 8 | uVar7;
          __size = (uVar7 >> 0x10 | uVar7) + 1;
          __ptr = (char *)realloc(__ptr,__size);
          if (__ptr == (char *)0x0) {
            return -1;
          }
        }
        memcpy(__ptr + uVar14,pcVar3,sVar16);
        uVar7 = uVar14 + sVar16;
        if (iVar15 == -1) {
          return -1;
        }
      }
      if (__size <= uVar14) {
        uVar5 = uVar14 >> 1 | uVar14;
        uVar5 = uVar5 >> 2 | uVar5;
        uVar5 = uVar5 >> 4 | uVar5;
        uVar5 = uVar5 >> 8 | uVar5;
        __size = (uVar5 >> 0x10 | uVar5) + 1;
        __ptr = (char *)realloc(__ptr,__size);
        if (__ptr == (char *)0x0) {
          return -1;
        }
      }
      (__ptr + uVar7)[0] = '\n';
      (__ptr + uVar7)[1] = '\0';
      pkVar4 = hdr->h;
      uVar9 = pkVar4->n_buckets;
    }
  }
  else {
    uVar13 = uVar9 - 1 & 0x4844;
    iVar15 = 1;
    uVar12 = uVar13;
    do {
      bVar8 = (char)uVar12 * '\x02' & 0x1e;
      uVar10 = pkVar4->flags[uVar12 >> 4] >> bVar8;
      if (((uVar10 & 2) != 0) || (((uVar10 & 1) == 0 && (pkVar4->keys[uVar12] == 0x4844)))) {
        if ((pkVar4->flags[uVar12 >> 4] >> bVar8 & 3) != 0) {
          uVar12 = uVar9;
        }
        goto LAB_00138fc6;
      }
      uVar12 = uVar12 + iVar15 & uVar9 - 1;
      iVar15 = iVar15 + 1;
    } while (uVar12 != uVar13);
    __size = 0;
    uVar14 = 0;
    __ptr = (char *)0x0;
  }
  if (uVar9 != 0) {
    uVar7 = 0;
    do {
      if (((pkVar4->flags[uVar7 >> 4] >> ((char)uVar7 * '\x02' & 0x1fU) & 3) == 0) &&
         (pkVar4->keys[uVar7] != 0x4844)) {
        pSVar2 = pkVar4->vals[uVar7];
        local_50 = pSVar2;
        do {
          if (__size < uVar14 + 1) {
            uVar5 = uVar14 >> 1 | uVar14;
            uVar5 = uVar5 >> 2 | uVar5;
            uVar5 = uVar5 >> 4 | uVar5;
            uVar5 = uVar5 >> 8 | uVar5;
            __size = (uVar5 >> 0x10 | uVar5) + 1;
            __ptr = (char *)realloc(__ptr,__size);
            if (__ptr == (char *)0x0) {
              return -1;
            }
          }
          __ptr[uVar14] = '@';
          kVar1 = hdr->h->keys[uVar7];
          if (__size < uVar14 + 3) {
            uVar5 = uVar14 + 2 >> 1 | uVar14 + 2;
            uVar5 = uVar5 >> 2 | uVar5;
            uVar5 = uVar5 >> 4 | uVar5;
            uVar5 = uVar5 >> 8 | uVar5;
            __size = (uVar5 >> 0x10 | uVar5) + 1;
            __ptr = (char *)realloc(__ptr,__size);
            if (__ptr == (char *)0x0) {
              return -1;
            }
          }
          __ptr[uVar14 + 1] = (char)(kVar1 >> 8);
          __ptr[uVar14 + 2] = (char)kVar1;
          pSVar11 = (SAM_hdr_tag *)&local_50->tag;
          uVar5 = uVar14 + 3;
          while( true ) {
            pSVar11 = pSVar11->next;
            uVar14 = uVar5 + 1;
            if (pSVar11 == (SAM_hdr_tag *)0x0) break;
            if (__size < uVar14) {
              uVar6 = uVar5 >> 1 | uVar5;
              uVar6 = uVar6 >> 2 | uVar6;
              uVar6 = uVar6 >> 4 | uVar6;
              uVar6 = uVar6 >> 8 | uVar6;
              __size = (uVar6 >> 0x10 | uVar6) + 1;
              __ptr = (char *)realloc(__ptr,__size);
              if (__ptr == (char *)0x0) {
                return -1;
              }
            }
            __ptr[uVar5] = '\t';
            pcVar3 = pSVar11->str;
            iVar15 = pSVar11->len;
            sVar16 = (size_t)iVar15;
            if (__size < uVar14 + sVar16) {
              uVar5 = uVar5 + sVar16 >> 1 | uVar5 + sVar16;
              uVar5 = uVar5 >> 2 | uVar5;
              uVar5 = uVar5 >> 4 | uVar5;
              uVar5 = uVar5 >> 8 | uVar5;
              __size = (uVar5 >> 0x10 | uVar5) + 1;
              __ptr = (char *)realloc(__ptr,__size);
              if (__ptr == (char *)0x0) {
                return -1;
              }
            }
            memcpy(__ptr + uVar14,pcVar3,sVar16);
            uVar5 = uVar14 + sVar16;
            if (iVar15 == -1) {
              return -1;
            }
          }
          if (__size <= uVar14) {
            uVar6 = uVar14 >> 1 | uVar14;
            uVar6 = uVar6 >> 2 | uVar6;
            uVar6 = uVar6 >> 4 | uVar6;
            uVar6 = uVar6 >> 8 | uVar6;
            __size = (uVar6 >> 0x10 | uVar6) + 1;
            __ptr = (char *)realloc(__ptr,__size);
            if (__ptr == (char *)0x0) {
              return -1;
            }
          }
          (__ptr + uVar5)[0] = '\n';
          (__ptr + uVar5)[1] = '\0';
          local_50 = local_50->next;
        } while (local_50 != pSVar2);
        pkVar4 = hdr->h;
        uVar9 = pkVar4->n_buckets;
      }
      uVar12 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar12;
    } while (uVar12 != uVar9);
  }
  pcVar3 = (hdr->text).s;
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  (hdr->text).l = uVar14;
  (hdr->text).m = __size;
  (hdr->text).s = __ptr;
  return 0;
}

Assistant:

int sam_hdr_rebuild(SAM_hdr *hdr) {
    /* Order: HD then others */
    kstring_t ks = KS_INITIALIZER;
    khint_t k;


    k = kh_get(sam_hdr, hdr->h, K("HD"));
    if (k != kh_end(hdr->h)) {
	SAM_hdr_type *ty = kh_val(hdr->h, k);
	SAM_hdr_tag *tag;
	if (EOF == kputs("@HD", &ks))
	    return -1;
	for (tag = ty->tag; tag; tag = tag->next) {
	    if (EOF == kputc_('\t', &ks))
		return -1;
	    if (EOF == kputsn_(tag->str, tag->len, &ks))
		return -1;
	}
	if (EOF == kputc('\n', &ks))
	    return -1;
    }

    for (k = kh_begin(hdr->h); k != kh_end(hdr->h); k++) {
	SAM_hdr_type *t1, *t2;

	if (!kh_exist(hdr->h, k))
	    continue;

	if (kh_key(hdr->h, k) == K("HD"))
	    continue;

	t1 = t2 = kh_val(hdr->h, k);
	do {
	    SAM_hdr_tag *tag;
	    char c[2];

	    if (EOF == kputc_('@', &ks))
		return -1;
	    c[0] = kh_key(hdr->h, k)>>8;
	    c[1] = kh_key(hdr->h, k)&0xff;
	    if (EOF == kputsn_(c, 2, &ks))
		return -1;
	    for (tag = t1->tag; tag; tag=tag->next) {
		if (EOF == kputc_('\t', &ks))
		    return -1;
		if (EOF == kputsn_(tag->str, tag->len, &ks))
		    return -1;
	    }
	    if (EOF == kputc('\n', &ks))
		return -1;
	    t1 = t1->next;
	} while (t1 != t2);
    }

    if (ks_str(&hdr->text))
	KS_FREE(&hdr->text);

    hdr->text = ks;

    return 0;
}